

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::NextValBind(duckdb *this,ScalarFunctionBindInput *bind_input,ScalarFunction *param_2,
                   vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   *arguments)

{
  Binder *binder;
  ClientContext *context;
  int iVar1;
  reference pvVar2;
  pointer pEVar3;
  type expr;
  SequenceCatalogEntry *pSVar4;
  undefined8 *puVar5;
  ParameterNotResolvedException *this_00;
  NotImplementedException *this_01;
  Value seqname;
  string local_90;
  Value local_70;
  
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  iVar1 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[6])(pEVar3);
  if ((char)iVar1 == '\0') {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar2);
    if ((pEVar3->return_type).id_ != UNKNOWN) {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar2);
      iVar1 = (*(pEVar3->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar3);
      if ((char)iVar1 != '\0') {
        binder = bind_input->binder;
        context = binder->context;
        puVar5 = (undefined8 *)0x0;
        pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,0);
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar2);
        ExpressionExecutor::EvaluateScalar(&local_70,context,expr,false);
        if (local_70.is_null == false) {
          Value::ToString_abi_cxx11_(&local_90,&local_70);
          pSVar4 = BindSequence(binder,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          puVar5 = (undefined8 *)operator_new(0x18);
          *puVar5 = &PTR__NextvalBindData_02452020;
          puVar5[1] = pSVar4;
          (*(pSVar4->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry
            [8])(puVar5 + 2,pSVar4);
        }
        *(undefined8 **)this = puVar5;
        Value::~Value(&local_70);
        return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
               (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
      }
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_70.type_._0_8_ = (long)&local_70 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,
                 "currval/nextval requires a constant sequence - non-constant sequences are no longer supported"
                 ,"");
      NotImplementedException::NotImplementedException(this_01,(string *)&local_70);
      __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
  ParameterNotResolvedException::ParameterNotResolvedException(this_00);
  __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,::std::runtime_error::~runtime_error)
  ;
}

Assistant:

static unique_ptr<FunctionData> NextValBind(ScalarFunctionBindInput &bind_input, ScalarFunction &,
                                            vector<unique_ptr<Expression>> &arguments) {
	if (arguments[0]->HasParameter() || arguments[0]->return_type.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}
	if (!arguments[0]->IsFoldable()) {
		throw NotImplementedException(
		    "currval/nextval requires a constant sequence - non-constant sequences are no longer supported");
	}
	auto &binder = bind_input.binder;
	// parameter to nextval function is a foldable constant
	// evaluate the constant and perform the catalog lookup already
	auto seqname = ExpressionExecutor::EvaluateScalar(binder.context, *arguments[0]);
	if (seqname.IsNull()) {
		return nullptr;
	}
	auto &seq = BindSequence(binder, seqname.ToString());
	return make_uniq<NextvalBindData>(seq);
}